

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManComputeDimensions(Emb_Man_t *p,int nDims)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Emb_Dat_t *pEVar6;
  Emb_Obj_t *pEVar7;
  int iVar8;
  long lVar9;
  
  pVVar5 = Emb_ManConnectedComponents(p);
  iVar2 = pVVar5->nSize;
  if (1 < (long)iVar2) {
    piVar3 = p->pObjData;
    for (lVar9 = 0; iVar2 != lVar9; lVar9 = lVar9 + 1) {
      uVar4 = Vec_IntEntry(pVVar5,(int)lVar9);
      if (p->pObjData == (int *)0x0) break;
      puVar1 = (uint *)(p->pObjData + uVar4);
      if ((*puVar1 & 2) == 0) {
        __assert_fail("Emb_ObjIsCo(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x45c,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
      }
      uVar4 = piVar3[2] - puVar1[2];
      piVar3[lVar9 + 5] = uVar4;
      puVar1[(ulong)(((*puVar1 >> 4) + puVar1[1]) - 1) + 5] = uVar4;
    }
  }
  Vec_IntFree(pVVar5);
  if (p->pVecs != (Emb_Dat_t *)0x0) {
    __assert_fail("p->pVecs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x463,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
  }
  pEVar6 = (Emb_Dat_t *)calloc((long)p->nObjs * (long)nDims,4);
  p->pVecs = pEVar6;
  pVVar5 = Vec_IntAlloc(nDims);
  pEVar7 = Emb_ManRandomVertex(p);
  Vec_IntPush(pVVar5,pEVar7->hHandle);
  iVar8 = 0;
  pEVar7 = Emb_ManFindDistances(p,pVVar5,(Emb_Dat_t *)0x0);
  iVar2 = p->nReached;
  pVVar5->nSize = 0;
  if (nDims < 1) {
    nDims = 0;
  }
  while (nDims != iVar8) {
    Vec_IntPush(pVVar5,pEVar7->hHandle);
    if (iVar2 + -1 == iVar8) break;
    pEVar7 = Emb_ManFindDistances(p,pVVar5,p->pVecs + (long)iVar8 * (long)p->nObjs);
    iVar8 = iVar8 + 1;
    if (iVar2 != p->nReached) {
      __assert_fail("nReached == p->nReached",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                    ,0x47c,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
    }
  }
  Vec_IntFree(pVVar5);
  return;
}

Assistant:

void Emb_ManComputeDimensions( Emb_Man_t * p, int nDims )
{
    Emb_Obj_t * pRandom, * pPivot;
    Vec_Int_t * vStart, * vComps;
    int d, nReached;
    int i;//, Counter;
    // connect unconnected components
    vComps = Emb_ManConnectedComponents( p );
//    printf( "Components = %d. Considered %d objects (out of %d).\n", Vec_IntSize(vComps), p->nReached, Emb_ManObjNum(p) );
    if ( Vec_IntSize(vComps) > 1 )
    {
        Emb_Obj_t * pFanin, * pObj = Emb_ManObj( p, 0 );
        Emb_ManForEachObjVec( vComps, p, pFanin, i )
        {
            assert( Emb_ObjIsCo(pFanin) );
            pFanin->Fanios[pFanin->nFanins + pFanin->nFanouts-1] = 
                pObj->Fanios[i] = pObj->hHandle - pFanin->hHandle;
        }
    }
    Vec_IntFree( vComps );
    // allocate memory for vectors
    assert( p->pVecs == NULL );
    p->pVecs = ABC_CALLOC( Emb_Dat_t, p->nObjs * nDims );
//    for ( i = 0; i < p->nObjs * nDims; i++ )
//        p->pVecs[i] = ABC_INFINITY;
    vStart = Vec_IntAlloc( nDims );
    // get the pivot vertex
    pRandom = Emb_ManRandomVertex( p );
    Vec_IntPush( vStart, pRandom->hHandle );
    // get the most distant vertex from the pivot
    pPivot = Emb_ManFindDistances( p, vStart, NULL );
//    Emb_DumpGraphIntoFile( p );
    nReached = p->nReached;
    if ( nReached < Emb_ManObjNum(p) )
    {
//        printf( "Considering a connected component with %d objects (out of %d).\n", p->nReached, Emb_ManObjNum(p) );
    }
    // start dimensions with this vertex
    Vec_IntClear( vStart );
    for ( d = 0; d < nDims; d++ )
    {
//        printf( "%3d : Adding vertex %7d with distance %3d.\n", d+1, pPivot->Value, p->nDistMax ); 
        Vec_IntPush( vStart, pPivot->hHandle );
        if ( d+1 == nReached )
            break;
        pPivot = Emb_ManFindDistances( p, vStart, Emb_ManVec(p, d) );
        assert( nReached == p->nReached );
    }
    Vec_IntFree( vStart );
    // make sure the number of reached objects is correct
//    Counter = 0;
//    for ( i = 0; i < p->nObjs; i++ )
//        if ( p->pVecs[i] < ABC_INFINITY )
//            Counter++;
//    assert( Counter == nReached );
}